

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint8_t *puVar11;
  short *psVar12;
  int iVar13;
  short *psVar14;
  uint uVar15;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    lVar7 = (long)(int)uVar2;
    puVar11 = peVar4[2].field_12.decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    psVar12 = (short *)decode->unpacked_buffer;
    iVar13 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar8 = 0;
        psVar14 = psVar12;
        do {
          uVar9 = (uint)psVar14[lVar7 * 2];
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar8) = uVar10;
          uVar9 = (uint)psVar14[lVar7];
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar8 + 4) = uVar10;
          uVar9 = (uint)*psVar14;
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar8 + 8) = uVar10;
          psVar14 = psVar14 + 1;
          lVar8 = lVar8 + 0xc;
        } while ((ulong)uVar2 * 0xc != lVar8);
      }
      psVar12 = psVar12 + lVar7 * 3;
      puVar11 = puVar11 + iVar3;
      iVar13 = iVar13 + 1;
    } while (iVar13 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}